

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

_Bool IsCardMovableToDesk(Card_t card,SolStack_t *stackPtr)

{
  _Bool _Var1;
  Card_t *pCVar2;
  undefined1 local_79;
  Card_t *topCardPtr;
  SolStack_t *stackPtr_local;
  undefined4 local_18;
  Card_t card_local;
  
  if (stackPtr == (SolStack_t *)0x0) {
    card_local.m_color._3_1_ = CC_SPADES >> 0x18;
  }
  else {
    pCVar2 = stk_CTopCard(stackPtr);
    if (pCVar2 == (Card_t *)0x0) {
      local_18 = card.m_type;
      card_local.m_color._3_1_ = local_18 == CT_KING;
    }
    else {
      _Var1 = card_IsOneLess(card,*pCVar2);
      local_79 = false;
      if (_Var1) {
        local_79 = card_IsOppositeColor(card,*pCVar2);
      }
      card_local.m_color._3_1_ = local_79;
    }
  }
  return (_Bool)card_local.m_color._3_1_;
}

Assistant:

static bool IsCardMovableToDesk(Card_t card, const SolStack_t* stackPtr)
{
  if (stackPtr) {
    const Card_t* topCardPtr = stk_CTopCard(stackPtr);
    if (topCardPtr) {
      return (card_IsOneLess(card, *topCardPtr) &&
              card_IsOppositeColor(card, *topCardPtr));
    } else {
      return (card.m_type == CT_KING);
    }
  }
  return false;
}